

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

int __thiscall vm_rcdesc::init(vm_rcdesc *this,EVP_PKEY_CTX *ctx)

{
  uchar *puVar1;
  unsigned_short in_CX;
  vm_obj_id_t in_EDX;
  vm_val_t *in_R8;
  int in_R9D;
  
  this->name = (char *)ctx;
  (this->bifptr).typ = VM_NIL;
  (this->self).typ = VM_OBJ;
  (this->self).val.obj = in_EDX;
  this->method_idx = in_CX;
  this->argp = in_R8;
  this->argc = in_R9D;
  if (pc_ptr_ == (uchar **)0x0) {
    puVar1 = (uchar *)0x0;
  }
  else {
    puVar1 = *pc_ptr_;
  }
  this->caller_addr = puVar1;
  return (int)puVar1;
}

Assistant:

void vm_rcdesc::init(VMG_ const char *name,
                     vm_obj_id_t self, unsigned short method_idx,
                     vm_val_t *argp, int argc)
{
    this->name = name;
    this->bifptr.set_nil();
    this->self.set_obj(self);
    this->method_idx = method_idx;
    this->argp = argp;
    this->argc = argc;
    this->caller_addr = G_interpreter->get_last_pc();
}